

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

ScriptFunction *
Js::ScriptFunction::OP_NewScFunc(FrameDisplay *environment,FunctionInfoPtrPtr infoRef)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  FunctionInfo *this;
  FunctionProxy *this_00;
  ThreadContext *threadContext;
  FunctionBody *pFVar7;
  char16 *pcVar8;
  undefined4 extraout_var;
  JavascriptLibrary *pJVar9;
  ScriptFunctionType *pSVar10;
  ScriptFunctionType *pSVar11;
  DynamicTypeHandler *pDVar12;
  ScriptFunctionType *scFuncType;
  char16 debugStringBuffer [42];
  ScriptFunctionWithInlineCache *pfuncScriptWithInlineCache;
  FunctionBody *functionBody;
  ScriptFunctionWithInlineCache *local_50;
  ScriptFunction *pfuncScript;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext;
  FunctionProxy *functionProxy;
  FunctionInfoPtrPtr infoRef_local;
  FrameDisplay *environment_local;
  
  if (infoRef == (FunctionInfoPtrPtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x3a,"(infoRef!= nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  this = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(infoRef);
  this_00 = FunctionInfo::GetFunctionProxy(this);
  if (this_00 == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x3c,"(functionProxy!= nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  reentrancylock._24_8_ = FunctionProxy::GetScriptContext(this_00);
  threadContext = ScriptContext::GetThreadContext((ScriptContext *)reentrancylock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)&pfuncScript,threadContext);
  local_50 = (ScriptFunctionWithInlineCache *)0x0;
  bVar2 = FunctionProxy::IsFunctionBody(this_00);
  if (bVar2) {
    pFVar7 = FunctionProxy::GetFunctionBody(this_00);
    bVar2 = FunctionBody::GetInlineCachesOnFunctionObject(pFVar7);
    if (bVar2) {
      pFVar7 = FunctionProxy::GetFunctionBody(this_00);
      bVar2 = FunctionBody::GetIsFirstFunctionObject(pFVar7);
      if (bVar2) {
        FunctionBody::SetIsNotFirstFunctionObject(pFVar7);
      }
      else {
        pJVar9 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
        register0x00000000 = JavascriptLibrary::CreateScriptFunctionWithInlineCache(pJVar9,this_00);
        ScriptFunctionWithInlineCache::CreateInlineCache(register0x00000000);
        uVar3 = FunctionBody::GetInlineCacheCount(pFVar7);
        uVar4 = FunctionBody::GetIsInstInlineCacheCount(pFVar7);
        if (uVar3 + uVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                      ,0x4e,
                                      "(functionBody->GetInlineCacheCount() + functionBody->GetIsInstInlineCacheCount())"
                                      ,
                                      "functionBody->GetInlineCacheCount() + functionBody->GetIsInstInlineCacheCount()"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ScriptFunctionWithInlineCachePhase);
        if (bVar2) {
          pcVar8 = FunctionProxy::GetDebugNumberSet
                             ((FunctionProxy *)pFVar7,(wchar (*) [42])&scFuncType);
          iVar5 = (*(pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])();
          Output::Print(L"Function object with inline cache: function number: (%s)\tfunction name: %s\n"
                        ,pcVar8,CONCAT44(extraout_var,iVar5));
          Output::Flush();
        }
        local_50 = stack0xffffffffffffff90;
      }
    }
  }
  if (local_50 == (ScriptFunctionWithInlineCache *)0x0) {
    pJVar9 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
    local_50 = (ScriptFunctionWithInlineCache *)
               JavascriptLibrary::CreateScriptFunction(pJVar9,this_00);
  }
  SetEnvironment(&local_50->super_ScriptFunction,environment);
  pSVar10 = FunctionProxy::GetUndeferredFunctionType(this_00);
  if (pSVar10 != (ScriptFunctionType *)0x0) {
    pSVar10 = (ScriptFunctionType *)RecyclableObject::GetType((RecyclableObject *)local_50);
    pSVar11 = FunctionProxy::GetDeferredPrototypeType(this_00);
    if (pSVar10 == pSVar11) {
      pDVar12 = DynamicObject::GetTypeHandler((DynamicObject *)local_50);
      (*pDVar12->_vptr_DynamicTypeHandler[0x10])(pDVar12,local_50);
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)&pfuncScript);
  return &local_50->super_ScriptFunction;
}

Assistant:

ScriptFunction * ScriptFunction::OP_NewScFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef)
    {
        AssertMsg(infoRef!= nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
        FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
        AssertMsg(functionProxy!= nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
        ScriptContext* scriptContext = functionProxy->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewScFunc, reentrancylock, scriptContext->GetThreadContext());

        ScriptFunction * pfuncScript = nullptr;
        if (functionProxy->IsFunctionBody() && functionProxy->GetFunctionBody()->GetInlineCachesOnFunctionObject())
        {
            FunctionBody * functionBody = functionProxy->GetFunctionBody();
            if (functionBody->GetIsFirstFunctionObject())
            {
                functionBody->SetIsNotFirstFunctionObject();
            }
            else
            {
                ScriptFunctionWithInlineCache* pfuncScriptWithInlineCache = scriptContext->GetLibrary()->CreateScriptFunctionWithInlineCache(functionProxy);
                // allocate inline cache for this function object
                pfuncScriptWithInlineCache->CreateInlineCache();

                Assert(functionBody->GetInlineCacheCount() + functionBody->GetIsInstInlineCacheCount());
                if (PHASE_TRACE1(Js::ScriptFunctionWithInlineCachePhase))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                    Output::Print(_u("Function object with inline cache: function number: (%s)\tfunction name: %s\n"),
                        functionBody->GetDebugNumberSet(debugStringBuffer), functionBody->GetDisplayName());
                    Output::Flush();
                }

                pfuncScript = pfuncScriptWithInlineCache;
            }
        }

        if (pfuncScript == nullptr)
        {
            pfuncScript = scriptContext->GetLibrary()->CreateScriptFunction(functionProxy);
        }

        pfuncScript->SetEnvironment(environment);

        ScriptFunctionType *scFuncType = functionProxy->GetUndeferredFunctionType();
        if (scFuncType && pfuncScript->GetType() == functionProxy->GetDeferredPrototypeType())
        {
            pfuncScript->GetTypeHandler()->EnsureObjectReady(pfuncScript);
        }

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(pfuncScript, EtwTrace::GetFunctionId(functionProxy)));

        return pfuncScript;
        JIT_HELPER_END(ScrFunc_OP_NewScFunc);
    }